

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void recomputeColumnsNotIndexed(Index *pIdx)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = 0;
  for (uVar2 = (ulong)pIdx->nColumn; 0 < (long)uVar2; uVar2 = uVar2 - 1) {
    uVar3 = (ulong)pIdx->aiColumn[uVar2 - 1];
    if (((-1 < (long)uVar3) && ((ushort)pIdx->aiColumn[uVar2 - 1] < 0x3f)) &&
       ((pIdx->pTable->aCol[uVar3].colFlags & 0x20) == 0)) {
      uVar1 = uVar1 | 1L << (uVar3 & 0x3f);
    }
  }
  pIdx->colNotIdxed = ~uVar1;
  return;
}

Assistant:

static void recomputeColumnsNotIndexed(Index *pIdx){
  Bitmask m = 0;
  int j;
  Table *pTab = pIdx->pTable;
  for(j=pIdx->nColumn-1; j>=0; j--){
    int x = pIdx->aiColumn[j];
    if( x>=0 && (pTab->aCol[x].colFlags & COLFLAG_VIRTUAL)==0 ){
      testcase( x==BMS-1 );
      testcase( x==BMS-2 );
      if( x<BMS-1 ) m |= MASKBIT(x);
    }
  }
  pIdx->colNotIdxed = ~m;
  assert( (pIdx->colNotIdxed>>63)==1 );  /* See note-20221022-a */
}